

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shm_reader.cpp
# Opt level: O0

vector<char,_std::allocator<char>_> * __thiscall
diffusion::ShmReader::cyclic_read
          (vector<char,_std::allocator<char>_> *__return_storage_ptr__,ShmReader *this,Size size)

{
  char *pcVar1;
  int local_6c;
  int32_t bytes_can_be_read_without_wrap;
  int32_t space_left;
  char *write_pointer;
  Size bytes_left;
  allocator_type local_1e;
  undefined1 local_1d;
  Size local_1c;
  ShmReader *pSStack_18;
  Size size_local;
  ShmReader *this_local;
  vector<char,_std::allocator<char>_> *data;
  
  local_1d = 0;
  local_1c = size;
  pSStack_18 = this;
  this_local = (ShmReader *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::vector<char,_std::allocator<char>_>::vector(__return_storage_ptr__,(long)size,&local_1e);
  std::allocator<char>::~allocator(&local_1e);
  write_pointer._0_4_ = local_1c;
  while (0 < (int)write_pointer) {
    pcVar1 = std::vector<char,_std::allocator<char>_>::data(__return_storage_ptr__);
    local_6c = this->shm_body_size_ - this->reader_shm_body_offset_;
    if ((int)write_pointer <= local_6c) {
      local_6c = (int)write_pointer;
    }
    memcpy(pcVar1 + ((long)local_1c - (long)(int)write_pointer),
           this->shm_body_position_ + this->reader_shm_body_offset_,(long)local_6c);
    this->reader_shm_body_offset_ = local_6c + this->reader_shm_body_offset_;
    write_pointer._0_4_ = (int)write_pointer - local_6c;
    if (this->reader_shm_body_offset_ == this->shm_body_size_) {
      this->reader_shm_body_offset_ = 0;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<char> ShmReader::cyclic_read(Size size) {
    std::vector<char> data(size);
    auto bytes_left = size;
    while (bytes_left > 0) {
        auto write_pointer = data.data() + size - bytes_left;
        auto space_left = shm_body_size_ - reader_shm_body_offset_;
        auto bytes_can_be_read_without_wrap = (bytes_left > space_left) ? space_left : bytes_left;
        std::memcpy(write_pointer, shm_body_position_ + reader_shm_body_offset_, bytes_can_be_read_without_wrap);
        reader_shm_body_offset_ += bytes_can_be_read_without_wrap;
        bytes_left -= bytes_can_be_read_without_wrap;
        if (reader_shm_body_offset_ == shm_body_size_) {
            reader_shm_body_offset_ = 0;
        }
    }
    return data;
}